

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiStreamParser.cpp
# Opt level: O1

void __thiscall
MT32Emu::MidiStreamParserImpl::processShortMessage(MidiStreamParserImpl *this,Bit32u message)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  ulong uVar4;
  MidiReceiver *pMVar5;
  
  uVar4 = (ulong)message;
  bVar1 = (byte)message;
  if ((~message & 0xf8) == 0) {
    pMVar5 = this->midiReceiver;
    UNRECOVERED_JUMPTABLE = pMVar5->_vptr_MidiReceiver[2];
    uVar4 = uVar4 & 0xff;
    goto LAB_0017862e;
  }
  if ((char)bVar1 < '\0') {
    if (bVar1 < 0xf0) {
      this->runningStatus = bVar1;
    }
    else if (bVar1 < 0xf8) {
      this->runningStatus = '\0';
    }
LAB_001785fa:
    bVar2 = false;
    bVar3 = bVar1;
  }
  else {
    bVar3 = this->runningStatus;
    if (-1 < (char)bVar3) {
      (**this->midiReporter->_vptr_MidiReporter)
                (this->midiReporter,
                 "processStatusByte: No valid running status yet, MIDI message ignored");
      goto LAB_001785fa;
    }
    bVar2 = true;
  }
  if (bVar2) {
    pMVar5 = this->midiReceiver;
    uVar4 = (ulong)((uint)bVar3 | message << 8);
    UNRECOVERED_JUMPTABLE = *pMVar5->_vptr_MidiReceiver;
  }
  else {
    if (-1 < (char)bVar3) {
      return;
    }
    pMVar5 = this->midiReceiver;
    UNRECOVERED_JUMPTABLE = *pMVar5->_vptr_MidiReceiver;
  }
LAB_0017862e:
  (*UNRECOVERED_JUMPTABLE)(pMVar5,uVar4);
  return;
}

Assistant:

void MidiStreamParserImpl::processShortMessage(const Bit32u message) {
	// Adds running status to the MIDI message if it doesn't contain one
	Bit8u status = Bit8u(message & 0xFF);
	if (0xF8 <= status) {
		midiReceiver.handleSystemRealtimeMessage(status);
	} else if (processStatusByte(status)) {
		midiReceiver.handleShortMessage((message << 8) | status);
	} else if (0x80 <= status) { // If no running status available yet, skip this message
		midiReceiver.handleShortMessage(message);
	}
}